

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeyboard.cpp
# Opt level: O2

void __thiscall OIS::LinuxKeyboard::_handleKeyPress(LinuxKeyboard *this,XEvent *event)

{
  TextTranslationMode TVar1;
  int iVar2;
  int iVar3;
  uint text;
  KeyCode kc;
  allocator_type local_45;
  int status;
  KeySym keySym;
  int local_34;
  
  if ((_handleKeyPress(_XEvent&)::buf == '\0') &&
     (iVar2 = __cxa_guard_acquire(&_handleKeyPress(_XEvent&)::buf), iVar2 != 0)) {
    std::vector<char,_std::allocator<char>_>::vector(&_handleKeyPress::buf,0x20,&local_45);
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&_handleKeyPress::buf,
                 &__dso_handle);
    __cxa_guard_release(&_handleKeyPress(_XEvent&)::buf);
  }
  iVar2 = XFilterEvent(event,0);
  if (this->xic == (XIC)0x0) {
    iVar3 = XLookupString(event,_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                          ~(uint)_handleKeyPress::buf.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                          (int)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&keySym,0);
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = '\0';
  }
  else {
    local_34 = iVar2;
    do {
      iVar3 = Xutf8LookupString(this->xic,event,
                                _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                ~(uint)_handleKeyPress::buf.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                (int)_handleKeyPress::buf.
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish,&keySym,&status);
      _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = '\0';
      iVar2 = local_34;
      if (status != -1) break;
      std::vector<char,_std::allocator<char>_>::resize
                (&_handleKeyPress::buf,
                 (CONCAT44(_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,
                           (int)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_finish) -
                 (long)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 2);
      iVar2 = local_34;
    } while (status == -1);
  }
  text = 0;
  if ((iVar2 == 0) && (text = 0, 0 < iVar3)) {
    TVar1 = (this->super_Keyboard).mTextMode;
    if (TVar1 == Ascii) {
      text = (uint)*_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else if (TVar1 == Unicode) {
      text = UTF8ToUTF32((uchar *)_handleKeyPress::buf.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    }
  }
  (this->super_Keyboard).mModifiers =
       (uint)((this->numLockMask & (event->xkey).state) != 0) << 0x10 |
       (uint)((this->capsLockMask & (event->xkey).state) != 0) << 0xc |
       (this->super_Keyboard).mModifiers & 0xfffeefff;
  kc = KeySymToOISKeyCode(this,keySym);
  _injectKeyDown(this,kc,text);
  if ((((event->xkey).state & 8) != 0) && (keySym == 0xff09)) {
    *(undefined1 *)
     ((long)&(this->super_Keyboard).super_Object.mCreator[1].mFactories.
             super__Vector_base<OIS::FactoryCreator_*,_std::allocator<OIS::FactoryCreator_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  }
  return;
}

Assistant:

void LinuxKeyboard::_handleKeyPress(XEvent& event)
{
	XKeyEvent& e = (XKeyEvent&)event;
	static std::vector<char> buf(32);
	KeySym keySym;
	unsigned int character = 0;
	int bytes			   = 0;
	bool haveChar		   = true;

	haveChar = !XFilterEvent(&event, None);

	if(xic)
	{
		Status status;
		do
		{
			bytes	   = Xutf8LookupString(xic, &e, &buf[0], buf.size() - 1, &keySym, &status);
			buf[bytes] = '\0';

			if(status == XBufferOverflow)
				buf.resize(buf.size() * 2);
		} while(status == XBufferOverflow);
	}
	else
	{
		bytes	   = XLookupString(&e, &buf[0], buf.size() - 1, &keySym, NULL);
		buf[bytes] = '\0';
	}

	if(haveChar && bytes > 0)
	{
		if(mTextMode == Unicode)
			character = UTF8ToUTF32(reinterpret_cast<unsigned char*>(&buf[0]));
		else if(mTextMode == Ascii)
			character = buf[0];
	}

	if(e.state & capsLockMask)
		mModifiers |= CapsLock;
	else
		mModifiers &= ~CapsLock;

	if(e.state & numLockMask)
		mModifiers |= NumLock;
	else
		mModifiers &= ~NumLock;

	KeyCode kc = KeySymToOISKeyCode(keySym);
	_injectKeyDown(kc, character);

	//Check for Alt-Tab
	LinuxInputManager* linMan = static_cast<LinuxInputManager*>(mCreator);
	if((e.state & Mod1Mask) && (keySym == XK_Tab))
		linMan->_setGrabState(false);
}